

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

void __thiscall cmCTest::SetConfigType(cmCTest *this,char *ct)

{
  string *source;
  char *pcVar1;
  string confTypeEnv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (ct == (char *)0x0) {
    ct = "";
  }
  pcVar1 = (char *)(this->ConfigType)._M_string_length;
  source = &this->ConfigType;
  strlen(ct);
  std::__cxx11::string::_M_replace((ulong)source,0,pcVar1,(ulong)ct);
  cmsys::SystemTools::ReplaceString(source,".\\","");
  std::operator+(&local_40,"CMAKE_CONFIG_TYPE=",source);
  cmsys::SystemTools::PutEnv(&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTest::SetConfigType(const char* ct)
{
  this->ConfigType = ct ? ct : "";
  cmSystemTools::ReplaceString(this->ConfigType, ".\\", "");
  std::string confTypeEnv = "CMAKE_CONFIG_TYPE=" + this->ConfigType;
  cmSystemTools::PutEnv(confTypeEnv);
}